

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::anonymous_mode_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,anonymous_mode_alert *this)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  allocator<char> local_109;
  string local_108;
  char local_e8 [8];
  char msg [200];
  anonymous_mode_alert *this_local;
  
  torrent_alert::message_abi_cxx11_(&local_108,&this->super_torrent_alert);
  uVar2 = std::__cxx11::string::c_str();
  pcVar1 = message::msgs[this->kind];
  uVar3 = std::__cxx11::string::c_str();
  snprintf(local_e8,200,"%s: %s: %s",uVar2,pcVar1,uVar3);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_e8,&local_109);
  std::allocator<char>::~allocator(&local_109);
  return __return_storage_ptr__;
}

Assistant:

std::string anonymous_mode_alert::message() const
	{
		char msg[200];
		static char const* const msgs[] = {
			"tracker is not anonymous, set a proxy"
		};
		std::snprintf(msg, sizeof(msg), "%s: %s: %s"
			, torrent_alert::message().c_str()
			, msgs[kind], str.c_str());
		return msg;
	}